

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

int mcpl_str2int(char *str,size_t len,int64_t *res)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  *res = 0;
  if ((len == 0) && (len = strlen(str), len == 0)) {
LAB_001058e8:
    iVar2 = 0;
  }
  else {
    uVar3 = (ulong)(*str == '-');
    iVar2 = 1;
    lVar5 = 0;
    lVar4 = 0;
    do {
      if (len - uVar3 == lVar5) {
        lVar5 = -lVar4;
        if (*str != '-') {
          lVar5 = lVar4;
        }
        *res = lVar5;
        return 1;
      }
      if ((byte)(str[lVar5 + uVar3] - 0x3aU) < 0xf6) goto LAB_001058e8;
      lVar6 = (ulong)(byte)(str[lVar5 + uVar3] - 0x30) + lVar4 * 10;
      lVar5 = lVar5 + 1;
      bVar1 = lVar4 < lVar6;
      lVar4 = lVar6;
    } while (bVar1);
  }
  return iVar2;
}

Assistant:

MCPL_LOCAL int mcpl_str2int(const char* str, size_t len, int64_t* res)
{
  //portable 64bit str2int with error checking (only INT64_MIN might not be
  //possible to specify).
  *res = 0;
  if (!len)
    len=strlen(str);
  if (!len)
    return 0;
  int sign = 1;
  if (str[0]=='-') {
    sign = -1;
    len -= 1;
    str += 1;
  }
  int64_t tmp = 0;
  size_t i;
  for (i=0; i<len; ++i) {
    if (str[i]<'0'||str[i]>'9') {
      return 0;
    }
    int64_t prev = tmp;
    tmp *= 10;
    tmp += str[i] - '0';
    if (prev>=tmp)
      return 1;//overflow (hopefully it did not trigger a signal or FPE)
  }
  *res = sign * tmp;
  return 1;
}